

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void stbi__gif_parse_colortable(stbi__context *s,stbi_uc (*pal) [4],int num_entries,int transp)

{
  stbi_uc sVar1;
  ulong uVar2;
  
  for (uVar2 = 0; (uint)(~(num_entries >> 0x1f) & num_entries) != uVar2; uVar2 = uVar2 + 1) {
    sVar1 = stbi__get8(s);
    pal[uVar2][2] = sVar1;
    sVar1 = stbi__get8(s);
    pal[uVar2][1] = sVar1;
    sVar1 = stbi__get8(s);
    pal[uVar2][0] = sVar1;
    pal[uVar2][3] = -((uint)transp != uVar2);
  }
  return;
}

Assistant:

static void stbi__gif_parse_colortable(stbi__context *s, stbi_uc pal[256][4], int num_entries, int transp)
{
   int i;
   for (i=0; i < num_entries; ++i) {
      pal[i][2] = stbi__get8(s);
      pal[i][1] = stbi__get8(s);
      pal[i][0] = stbi__get8(s);
      pal[i][3] = transp == i ? 0 : 255;
   }
}